

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall spvtools::opt::Instruction::UpdateLexicalScope(Instruction *this,uint32_t scope)

{
  pointer pIVar1;
  pointer pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  DebugScope *pDVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  (this->dbg_scope_).lexical_scope_ = scope;
  auVar5 = _DAT_003206e0;
  auVar4 = _DAT_00312d20;
  auVar3 = _DAT_00312d10;
  pIVar1 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 != pIVar2) {
    uVar7 = (ulong)((long)pIVar2 + (-0x70 - (long)pIVar1)) >> 4;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar7;
    auVar10._8_4_ = SUB164(auVar13 * ZEXT816(0x2492492492492493),8);
    auVar10._0_8_ = uVar7 / 7;
    auVar10._12_4_ = (int)(uVar7 / 0x700000000);
    pDVar8 = &pIVar1[3].dbg_scope_;
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_00312d20;
    do {
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        pDVar8[-0x2a].lexical_scope_ = scope;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        pDVar8[-0x1c].lexical_scope_ = scope;
      }
      auVar13 = (auVar12 | auVar5) ^ auVar4;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar13._0_4_ <= auVar10._0_4_)) {
        pDVar8[-0xe].lexical_scope_ = scope;
        pDVar8->lexical_scope_ = scope;
      }
      uVar9 = uVar9 + 4;
      pDVar8 = pDVar8 + 0x38;
    } while ((uVar7 / 7 + 4 & 0xfffffffffffffffc) != uVar9);
  }
  bVar6 = IsLineInst(this);
  if ((!bVar6) && ((this->context_->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone)) {
    analysis::DebugInfoManager::AnalyzeDebugInst
              ((this->context_->debug_info_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
               _M_head_impl,this);
    return;
  }
  return;
}

Assistant:

void Instruction::UpdateLexicalScope(uint32_t scope) {
  dbg_scope_.SetLexicalScope(scope);
  for (auto& i : dbg_line_insts_) {
    i.dbg_scope_.SetLexicalScope(scope);
  }
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}